

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O1

mbedtls_mpi_uint
mbedtls_mpi_core_sub(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t limbs)

{
  mbedtls_mpi_uint mVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (limbs != 0) {
    mVar1 = 0;
    sVar2 = 0;
    do {
      uVar3 = A[sVar2] - mVar1;
      mVar1 = (ulong)(uVar3 < B[sVar2]) + (ulong)(A[sVar2] < mVar1);
      X[sVar2] = uVar3 - B[sVar2];
      sVar2 = sVar2 + 1;
    } while (limbs != sVar2);
    return mVar1;
  }
  return 0;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_sub(mbedtls_mpi_uint *X,
                                      const mbedtls_mpi_uint *A,
                                      const mbedtls_mpi_uint *B,
                                      size_t limbs)
{
    mbedtls_mpi_uint c = 0;

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint z = (A[i] < c);
        mbedtls_mpi_uint t = A[i] - c;
        c = (t < B[i]) + z;
        X[i] = t - B[i];
    }

    return c;
}